

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  TrackerContext *ctx;
  ITracker *pIVar1;
  ITracker *in_RDI;
  allocator *name;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  ITracker *in_stack_ffffffffffffffc8;
  Ptr<Catch::TestCaseTracking::ITracker> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  ctx = (TrackerContext *)operator_new(0x60);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  name = (allocator *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"{root}",name);
  SectionTracker::SectionTracker
            ((SectionTracker *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),(string *)name,ctx,in_RDI);
  Ptr<Catch::TestCaseTracking::ITracker>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *(undefined8 *)&(in_RDI->super_SharedImpl<Catch::IShared>).m_rc = 0;
  *(undefined4 *)
   &in_RDI[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable = 1
  ;
  pIVar1 = Ptr<Catch::TestCaseTracking::ITracker>::operator*
                     ((Ptr<Catch::TestCaseTracking::ITracker> *)in_RDI);
  return pIVar1;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
        m_rootTracker = new SectionTracker( "{root}", *this, CATCH_NULL );
        m_currentTracker = CATCH_NULL;
        m_runState = Executing;
        return *m_rootTracker;
    }